

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

void __thiscall gl4cts::ShaderSubroutine::FunctionalTest17::initTest(FunctionalTest17 *this)

{
  GLuint *pGVar1;
  bool bVar2;
  int iVar3;
  GLenum GVar4;
  undefined4 extraout_var;
  float *pfVar5;
  TestError *this_00;
  char *this_01;
  uint local_d4;
  string vs_body;
  string te_body;
  string tc_body;
  string gs_body;
  string fs_body;
  Functions *gl;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar3);
  (*gl->patchParameteri)(0x8e72,1);
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"glPatchParameteri() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x2413);
  (*gl->genVertexArrays)(1,&this->m_vao_id);
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"glGenVertexArrays() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x2417);
  (*gl->bindVertexArray)(this->m_vao_id);
  GVar4 = (*gl->getError)();
  this_01 = "glBindVertexArray() call failed.";
  glu::checkError(GVar4,"glBindVertexArray() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x241a);
  getFragmentShaderBody_abi_cxx11_(&fs_body,(FunctionalTest17 *)this_01);
  getGeometryShaderBody_abi_cxx11_(&gs_body,(FunctionalTest17 *)this_01);
  getTessellationControlShaderBody_abi_cxx11_(&tc_body,(FunctionalTest17 *)this_01);
  getTessellationEvaluationShaderBody_abi_cxx11_(&te_body,(FunctionalTest17 *)this_01);
  getVertexShaderBody_abi_cxx11_(&vs_body,(FunctionalTest17 *)this_01);
  local_d4 = 0;
  bVar2 = Utils::buildProgram(gl,&vs_body,&tc_body,&te_body,&gs_body,&fs_body,(GLchar **)0x0,
                              &local_d4,&this->m_vs_id,&this->m_tc_id,&this->m_te_id,&this->m_gs_id,
                              &this->m_fs_id,&this->m_po_id);
  if (bVar2) {
    pGVar1 = &this->m_to_id;
    (*gl->genTextures)(1,pGVar1);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"glGenTextures() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x242c);
    (*gl->bindTexture)(0xde1,*pGVar1);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"glBindTexture() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x242f);
    (*gl->texStorage2D)(0xde1,1,0x8814,this->m_to_width,this->m_to_height);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"glTexStorage2D() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x2433);
    (*gl->genFramebuffers)(1,&this->m_fbo_id);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"glGenFramebuffers() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x2437);
    (*gl->bindFramebuffer)(0x8d40,this->m_fbo_id);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"glBindFramebuffer() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x243a);
    (*gl->framebufferTexture2D)(0x8ca9,0x8ce0,0xde1,*pGVar1,0);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"glFramebufferTexture2D() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x243d);
    (*gl->pixelStorei)(0xd05,1);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"glPixelStorei() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x2441);
    pfVar5 = (float *)operator_new__((ulong)(this->m_to_width * this->m_to_height * 4) << 2);
    this->m_to_data = pfVar5;
    std::__cxx11::string::~string((string *)&vs_body);
    std::__cxx11::string::~string((string *)&te_body);
    std::__cxx11::string::~string((string *)&tc_body);
    std::__cxx11::string::~string((string *)&gs_body);
    std::__cxx11::string::~string((string *)&fs_body);
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Failed to link test program object",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
             ,0x2427);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void FunctionalTest17::initTest()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Configure GL_PATCH_VERTICES so that TC only takes a single patch vertex */
	gl.patchParameteri(GL_PATCH_VERTICES, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glPatchParameteri() call failed.");

	/* Generate & bind a VAO */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays() call failed.");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray() call failed.");

	/* Set up test program object */
	std::string fs_body = getFragmentShaderBody();
	std::string gs_body = getGeometryShaderBody();
	std::string tc_body = getTessellationControlShaderBody();
	std::string te_body = getTessellationEvaluationShaderBody();
	std::string vs_body = getVertexShaderBody();

	if (!Utils::buildProgram(gl, vs_body, tc_body, te_body, gs_body, fs_body, DE_NULL, /* xfb_varyings */
							 DE_NULL,												   /* n_xfb_varyings */
							 &m_vs_id, &m_tc_id, &m_te_id, &m_gs_id, &m_fs_id, &m_po_id))
	{
		TCU_FAIL("Failed to link test program object");
	}

	/* Set up a texture object that will be used as a color attachment */
	gl.genTextures(1, &m_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() call failed.");

	gl.bindTexture(GL_TEXTURE_2D, m_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

	gl.texStorage2D(GL_TEXTURE_2D, 1, /* levels */
					GL_RGBA32F, m_to_width, m_to_height);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage2D() call failed.");

	/* Set up FBO */
	gl.genFramebuffers(1, &m_fbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers() call failed.");

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer() call failed.");

	gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_to_id, 0 /* level */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture2D() call failed.");

	/* Make sure glReadPixels() does not return misaligned data */
	gl.pixelStorei(GL_PACK_ALIGNMENT, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glPixelStorei() call failed.");

	/* Initialize a buffer that will be used to store rendered data */
	m_to_data = new float[m_to_width * m_to_height * 4 /* rgba */];
}